

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
booster::locale::as::details::operator<<
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,set_domain *dom)

{
  undefined4 uVar1;
  int iVar2;
  message_format<wchar_t> *pmVar3;
  undefined8 in_RSI;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *in_RDI;
  int id;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  locale *in_stack_ffffffffffffffd0;
  locale local_20;
  undefined4 local_14;
  undefined8 local_10;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::ios_base::getloc((ios_base *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pmVar3 = std::use_facet<booster::locale::message_format<wchar_t>>(in_stack_ffffffffffffffd0);
  uVar1 = (**(code **)(*(long *)pmVar3 + 0x20))(pmVar3,local_10);
  std::locale::~locale(&local_20);
  local_14 = uVar1;
  iVar2 = booster::locale::ios_info::get
                    ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  booster::locale::ios_info::domain_id(iVar2);
  return local_8;
}

Assistant:

std::basic_ostream<CharType> &operator<<(std::basic_ostream<CharType> &out, set_domain const &dom)
                {
                    int id = std::use_facet<message_format<CharType> >(out.getloc()).domain(dom.domain_id);
                    ios_info::get(out).domain_id(id);
                    return out;
                }